

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_queue.h
# Opt level: O1

void __thiscall WorkQueue<CMU462::WorkItem>::clear(WorkQueue<CMU462::WorkItem> *this)

{
  pointer pWVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar2 == 0) {
    pWVar1 = (this->storage).super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->storage).super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>.
        _M_impl.super__Vector_impl_data._M_finish != pWVar1) {
      (this->storage).super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>.
      _M_impl.super__Vector_impl_data._M_finish = pWVar1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void clear() {
      lock.lock();
      storage.clear();
      lock.unlock();
    }